

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

pair<stx::btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>::iterator,_bool>
* __thiscall
stx::
btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
::insert_descend(pair<stx::btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>::iterator,_bool>
                 *__return_storage_ptr__,
                btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
                *this,node *n,key_type *key,data_type *value,key_type *splitkey,node **splitnode)

{
  key_type kVar1;
  node *pnVar2;
  bool bVar3;
  ushort uVar4;
  uint uVar5;
  size_t sVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  key_type newkey;
  node *local_60;
  undefined8 local_58;
  pair<stx::btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>::iterator,_bool>
  *local_40;
  key_type *local_38;
  
  local_40 = __return_storage_ptr__;
  if (n->level == 0) {
    uVar4 = n->slotuse;
    uVar5 = (uint)uVar4;
    uVar7 = (uint)uVar4;
    if (uVar4 == 0) {
      uVar9 = 0;
LAB_001090c9:
      uVar8 = (uint)uVar9;
      bVar3 = (int)uVar8 < (int)uVar7;
      uVar7 = uVar8;
      if ((bVar3) && (*key == *(double *)(n + (long)(int)uVar8 * 2 + 6))) {
        (__return_storage_ptr__->first).currnode = (leaf_node *)n;
        (__return_storage_ptr__->first).currslot = (unsigned_short)uVar9;
        *(ulong *)&(__return_storage_ptr__->first).field_0xa = (ulong)(uint6)local_58;
        *(undefined8 *)((long)&(__return_storage_ptr__->first).temp_value.first + 2) = 0;
        (__return_storage_ptr__->first).temp_value.second = (BufferNode<double,_long> *)0x0;
        __return_storage_ptr__->second = false;
        return __return_storage_ptr__;
      }
    }
    else {
      uVar9 = 0;
      do {
        if (*key <= *(double *)(n + uVar9 * 2 + 6)) goto LAB_001090c9;
        uVar9 = uVar9 + 1;
      } while (uVar4 != uVar9);
    }
    local_38 = splitkey;
    if (uVar4 == 0x10) {
      split_leaf_node(this,(leaf_node *)n,splitkey,splitnode);
      uVar4 = n->slotuse;
      uVar5 = (uint)uVar4;
      if ((int)(uint)uVar4 <= (int)uVar7) {
        n = *splitnode;
        uVar5 = (uint)(((leaf_node *)n)->super_node).slotuse;
        uVar7 = uVar7 - uVar4;
      }
    }
    lVar10 = (long)(int)uVar7;
    uVar9 = (ulong)(uVar5 << 3);
    sVar6 = uVar9 + lVar10 * -8;
    if (sVar6 != 0) {
      memmove((void *)((long)n + (uVar9 - sVar6) + 0x20),((leaf_node *)n)->slotkey + lVar10,sVar6);
      uVar4 = (((leaf_node *)n)->super_node).slotuse;
      uVar5 = (uint)uVar4;
      uVar9 = (ulong)uVar4 << 3;
    }
    sVar6 = uVar9 + lVar10 * -8;
    if (sVar6 != 0) {
      memmove((void *)((long)n + (uVar9 - sVar6) + 0xa0),((leaf_node *)n)->slotdata + lVar10,sVar6);
      uVar5 = (uint)(((leaf_node *)n)->super_node).slotuse;
    }
    kVar1 = *key;
    ((leaf_node *)n)->slotkey[lVar10] = kVar1;
    ((leaf_node *)n)->slotdata[lVar10] = *value;
    (((leaf_node *)n)->super_node).slotuse = (unsigned_short)(uVar5 + 1);
    if (((splitnode != (node **)0x0) && ((leaf_node *)n != (leaf_node *)*splitnode)) &&
       (uVar7 == (uVar5 + 1 & 0xffff) - 1)) {
      *local_38 = kVar1;
    }
    (local_40->first).currnode = (leaf_node *)n;
    (local_40->first).currslot = (unsigned_short)uVar7;
    *(ulong *)&(local_40->first).field_0xa = (ulong)(uint6)local_58;
    *(undefined8 *)((long)&(local_40->first).temp_value.first + 2) = 0;
    (local_40->first).temp_value.second = SUB168(ZEXT816(0),4);
    local_40->second = true;
  }
  else {
    uVar9 = 0;
    local_58._0_6_ = 0;
    local_58._6_2_ = 0;
    local_60 = (node *)0x0;
    uVar4 = n->slotuse;
    if (uVar4 != 0) {
      uVar9 = 0;
      do {
        if (*key <= *(double *)(n + uVar9 * 2 + 2)) goto LAB_00108f36;
        uVar9 = uVar9 + 1;
      } while ((uint)uVar4 != uVar9);
      uVar9 = (ulong)(uint)uVar4;
    }
LAB_00108f36:
    uVar7 = (uint)uVar9;
    lVar10 = (long)(int)uVar7;
    insert_descend(__return_storage_ptr__,this,*(node **)(n + lVar10 * 2 + 0x22),key,value,
                   (key_type *)&local_58,&local_60);
    if (local_60 != (node *)0x0) {
      uVar4 = n->slotuse;
      if (uVar4 == 0x10) {
        split_inner_node(this,(inner_node *)n,splitkey,splitnode,uVar7);
        uVar4 = n->slotuse;
        if ((uVar7 == uVar4 + 1) && (pnVar2 = *splitnode, uVar4 < pnVar2->slotuse)) {
          *(key_type *)(n + (ulong)uVar4 * 2 + 2) = *splitkey;
          *(undefined8 *)(n + (ulong)uVar4 * 2 + 0x24) = *(undefined8 *)(pnVar2 + 0x22);
          n->slotuse = uVar4 + 1;
          *(node **)(pnVar2 + 0x22) = local_60;
          *splitkey = (key_type)CONCAT26(local_58._6_2_,(uint6)local_58);
          return local_40;
        }
        if ((int)(uint)uVar4 < (int)uVar7) {
          uVar7 = uVar7 + ~(uint)uVar4;
          n = *splitnode;
          uVar4 = n->slotuse;
          lVar10 = (long)(int)uVar7;
        }
      }
      sVar6 = (ulong)((uint)uVar4 * 8) + lVar10 * -8;
      if (sVar6 != 0) {
        memmove((void *)((long)n + ((uint)uVar4 * 8 - sVar6) + 0x10),n + lVar10 * 2 + 2,sVar6);
        uVar4 = n->slotuse;
      }
      sVar6 = (long)n + (((ulong)uVar4 * 8 + 0x90) - (long)(n + lVar10 * 2 + 0x22));
      if (sVar6 != 0) {
        memmove((void *)((long)n + ((ulong)uVar4 * 8 - sVar6) + 0x98),n + lVar10 * 2 + 0x22,sVar6);
        uVar4 = n->slotuse;
      }
      *(ulong *)(n + lVar10 * 2 + 2) = CONCAT26(local_58._6_2_,(uint6)local_58);
      *(node **)(n + (long)(int)uVar7 * 2 + 0x24) = local_60;
      n->slotuse = uVar4 + 1;
    }
  }
  return local_40;
}

Assistant:

std::pair<iterator, bool> insert_descend(node* n,
                                                 const key_type& key, const data_type& value,
                                                 key_type* splitkey, node** splitnode)
        {
            if (!n->isleafnode())
            {
                inner_node *inner = static_cast<inner_node*>(n);

                key_type newkey = key_type();
                node *newchild = NULL;

                int slot = find_lower(inner, key);

                BTREE_PRINT("btree::insert_descend into " << inner->childid[slot]);

                std::pair<iterator, bool> r = insert_descend(inner->childid[slot],
                                                             key, value, &newkey, &newchild);

                if (newchild)
                {
                    BTREE_PRINT("btree::insert_descend newchild with key " << newkey << " node " << newchild << " at slot " << slot);

                    if (inner->isfull())
                    {
                        split_inner_node(inner, splitkey, splitnode, slot);

                        BTREE_PRINT("btree::insert_descend done split_inner: putslot: " << slot << " putkey: " << newkey << " upkey: " << *splitkey);

#ifdef BTREE_DEBUG
                        if (debug)
                    {
                        print_node(std::cout, inner);
                        print_node(std::cout, *splitnode);
                    }
#endif

                        // check if insert slot is in the split sibling node
                        BTREE_PRINT("btree::insert_descend switch: " << slot << " > " << inner->slotuse+1);

                        if (slot == inner->slotuse+1 && inner->slotuse < (*splitnode)->slotuse)
                        {
                            // special case when the insert slot matches the split
                            // place between the two nodes, then the insert key
                            // becomes the split key.

                            BTREE_ASSERT(inner->slotuse + 1 < innerslotmax);

                            inner_node *splitinner = static_cast<inner_node*>(*splitnode);

                            // move the split key and it's datum into the left node
                            inner->slotkey[inner->slotuse] = *splitkey;
                            inner->childid[inner->slotuse+1] = splitinner->childid[0];
                            inner->slotuse++;

                            // set new split key and move corresponding datum into right node
                            splitinner->childid[0] = newchild;
                            *splitkey = newkey;

                            return r;
                        }
                        else if (slot >= inner->slotuse+1)
                        {
                            // in case the insert slot is in the newly create split
                            // node, we reuse the code below.

                            slot -= inner->slotuse+1;
                            inner = static_cast<inner_node*>(*splitnode);
                            BTREE_PRINT("btree::insert_descend switching to splitted node " << inner << " slot " << slot);
                        }
                    }

                    // move items and put pointer to child node into correct slot
                    BTREE_ASSERT(slot >= 0 && slot <= inner->slotuse);

                    std::copy_backward(inner->slotkey + slot, inner->slotkey + inner->slotuse,
                                       inner->slotkey + inner->slotuse+1);
                    std::copy_backward(inner->childid + slot, inner->childid + inner->slotuse+1,
                                       inner->childid + inner->slotuse+2);

                    inner->slotkey[slot] = newkey;
                    inner->childid[slot + 1] = newchild;
                    inner->slotuse++;
                }

                return r;
            }
            else // n->isleafnode() == true
            {
                leaf_node *leaf = static_cast<leaf_node*>(n);

                int slot = find_lower(leaf, key);

                if (!allow_duplicates && slot < leaf->slotuse && key_equal(key, leaf->slotkey[slot])) {
                    return std::pair<iterator, bool>(iterator(leaf, slot), false);
                }

                if (leaf->isfull())
                {
                    split_leaf_node(leaf, splitkey, splitnode);

                    // check if insert slot is in the split sibling node
                    if (slot >= leaf->slotuse)
                    {
                        slot -= leaf->slotuse;
                        leaf = static_cast<leaf_node*>(*splitnode);
                    }
                }

                // move items and put data item into correct data slot
                BTREE_ASSERT(slot >= 0 && slot <= leaf->slotuse);

                std::copy_backward(leaf->slotkey + slot, leaf->slotkey + leaf->slotuse,
                                   leaf->slotkey + leaf->slotuse+1);
                data_copy_backward(leaf->slotdata + slot, leaf->slotdata + leaf->slotuse,
                                   leaf->slotdata + leaf->slotuse+1);

                leaf->slotkey[slot] = key;
                if (!used_as_set) leaf->slotdata[slot] = value;
                leaf->slotuse++;

                if (splitnode && leaf != *splitnode && slot == leaf->slotuse-1)
                {
                    // special case: the node was split, and the insert is at the
                    // last slot of the old node. then the splitkey must be
                    // updated.
                    *splitkey = key;
                }

                return std::pair<iterator, bool>(iterator(leaf, slot), true);
            }
        }